

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbt2DShape.cpp
# Opt level: O2

void __thiscall
cbt2DsegmentShape::getAabb
          (cbt2DsegmentShape *this,cbtTransform *t,cbtVector3 *aabbMin,cbtVector3 *aabbMax)

{
  cbtScalar cVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 in_XMM0_Qb;
  undefined8 uVar10;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 in_XMM1_Qb;
  cbtVector3 cVar11;
  cbtVector3 cVar12;
  uint local_68;
  
  cVar11 = cbtTransform::operator()
                     (t,(cbtVector3 *)&(this->super_cbtConvexInternalShape).field_0x44);
  uVar10 = in_XMM0_Qb;
  cVar12 = cbtTransform::operator()(t,&this->P2);
  cVar1 = this->zthickness;
  auVar9 = ZEXT416((uint)cVar1);
  auVar6._8_8_ = in_XMM1_Qb;
  auVar6._0_8_ = cVar11.m_floats._8_8_;
  auVar4 = vfnmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)cVar1),auVar6);
  auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0x3f000000),0),ZEXT416((uint)cVar1),auVar6);
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar6 = auVar9;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar7 = auVar6;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar8 = auVar7;
  (*(this->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
    _vptr_cbtCollisionShape[0xc])(this);
  auVar5._8_8_ = in_XMM0_Qb;
  auVar5._0_8_ = cVar11.m_floats._0_8_;
  auVar2._8_8_ = uVar10;
  auVar2._0_8_ = cVar12.m_floats._0_8_;
  local_68 = auVar6._0_4_;
  auVar6 = vinsertps_avx(auVar9,ZEXT416(local_68),0x10);
  auVar9 = vminps_avx(auVar2,auVar5);
  auVar2 = vmaxps_avx(auVar2,auVar5);
  auVar6 = vsubps_avx(auVar9,auVar6);
  uVar10 = vmovlps_avx(auVar6);
  *(undefined8 *)aabbMin->m_floats = uVar10;
  aabbMin->m_floats[2] = auVar4._0_4_;
  aabbMin->m_floats[3] = 0.0;
  auVar6 = vinsertps_avx(auVar7,auVar8,0x10);
  auVar9._0_4_ = auVar2._0_4_ + auVar6._0_4_;
  auVar9._4_4_ = auVar2._4_4_ + auVar6._4_4_;
  auVar9._8_4_ = auVar2._8_4_ + auVar6._8_4_;
  auVar9._12_4_ = auVar2._12_4_ + auVar6._12_4_;
  uVar10 = vmovlps_avx(auVar9);
  *(undefined8 *)aabbMax->m_floats = uVar10;
  aabbMax->m_floats[2] = auVar3._0_4_ + 0.0;
  aabbMax->m_floats[3] = 0.0;
  return;
}

Assistant:

void cbt2DsegmentShape::getAabb(const cbtTransform& t,cbtVector3& aabbMin,cbtVector3& aabbMax) const
{
    cbtVector3 P1w = t*P1;
    cbtVector3 P2w = t*P2;
    cbtVector3 vminabs (std::min(P1w.x(),P2w.x()), std::min(P1w.y(),P2w.y()),  P1w.z()-(zthickness*0.5f));
    cbtVector3 vmaxabs (std::max(P1w.x(),P2w.x()), std::max(P1w.y(),P2w.y()),  P1w.z()+(zthickness*0.5f));
    vminabs -= cbtVector3(getMargin(),getMargin(),0);
    vmaxabs += cbtVector3(getMargin(),getMargin(),0);
    aabbMin = vminabs;
    aabbMax = vmaxabs;
}